

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_parquet_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::WriteParquetRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,WriteParquetRelation *this,idx_t depth)

{
  Relation *pRVar1;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_40,(Relation *)depth,depth);
  ::std::operator+(&local_80,&local_40,"Write To Parquet [");
  ::std::operator+(&local_a0,&local_80,&this->parquet_file);
  ::std::operator+(&local_60,&local_a0,"]\n");
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_40);
  pRVar1 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar1->_vptr_Relation[6])(&local_a0,pRVar1,depth + 1);
  ::std::operator+(__return_storage_ptr__,&local_60,&local_a0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string WriteParquetRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "Write To Parquet [" + parquet_file + "]\n";
	return str + child->ToString(depth + 1);
}